

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

WhileStatement * __thiscall SQCompilation::SQParser::parseWhileStatement(SQParser *this)

{
  undefined1 uVar1;
  SQParser *tok;
  SQInteger SVar2;
  Node *this_00;
  WhileStatement *pWVar3;
  SQParser *in_RDI;
  SQExpressionContext in_stack_0000002c;
  SQParser *in_stack_00000030;
  Statement *body;
  bool wrapped;
  Expr *cond;
  SQInteger c;
  SQInteger l;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff58;
  SQParser *in_stack_ffffffffffffff60;
  WhileStatement *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Expr *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  SQParser *in_stack_ffffffffffffffb0;
  bool *in_stack_ffffffffffffffd8;
  SQParser *this_01;
  NestingChecker local_18;
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  tok = (SQParser *)line(in_RDI);
  this_01 = tok;
  SVar2 = column(in_RDI);
  Consume(in_stack_ffffffffffffff60,(SQInteger)in_stack_ffffffffffffff58);
  Expect(in_stack_ffffffffffffffb0,(SQInteger)tok);
  Expression(in_stack_00000030,in_stack_0000002c);
  Expect(in_stack_ffffffffffffffb0,(SQInteger)tok);
  checkBraceIndentationStyle(in_stack_ffffffffffffff60);
  this_00 = &IfLikeBlock(this_01,in_stack_ffffffffffffffd8)->super_Node;
  uVar1 = IsEndOfStatement(in_RDI);
  if (!(bool)uVar1) {
    reportDiagnostic(in_RDI,0x38,"while loop body");
  }
  if ((in_RDI->_token != 0) && (in_RDI->_token != 0x7d)) {
    in_stack_ffffffffffffff78 = (Expr *)line(in_RDI);
    in_stack_ffffffffffffff74 = Node::lineEnd(this_00);
    if ((in_stack_ffffffffffffff78 != (Expr *)(long)in_stack_ffffffffffffff74) &&
       (in_stack_ffffffffffffff68 = (WhileStatement *)column(in_RDI),
       SVar2 < (long)in_stack_ffffffffffffff68)) {
      reportDiagnostic(in_RDI,0x68);
    }
  }
  pWVar3 = newNode<SQCompilation::WhileStatement,SQCompilation::Expr*,SQCompilation::Statement*>
                     ((SQParser *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78,
                      (Statement *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  pWVar3 = setCoordinates<SQCompilation::WhileStatement>
                     ((SQParser *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68,(SQInteger)pWVar3,
                      (SQInteger)in_stack_ffffffffffffff58);
  NestingChecker::~NestingChecker(&local_18);
  return pWVar3;
}

Assistant:

WhileStatement* SQParser::parseWhileStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_WHILE);

    Expect(_SC('('));
    Expr *cond = Expression(SQE_LOOP_CONDITION);
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "while loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<WhileStatement>(cond, body), l, c);
}